

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::VarExpr<(wabt::ExprType)9>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)9>_>_>
 __thiscall wabt::MakeUnique<wabt::VarExpr<(wabt::ExprType)9>,wabt::Var>(wabt *this,Var *args)

{
  VarExpr<(wabt::ExprType)9> *this_00;
  Location local_48;
  
  this_00 = (VarExpr<(wabt::ExprType)9> *)operator_new(0x88);
  local_48.field_1.field_0.line = 0;
  local_48.field_1._4_8_ = 0;
  local_48.filename.data_ = (char *)0x0;
  local_48.filename.size_._0_4_ = 0;
  local_48.filename.size_._4_4_ = 0;
  VarExpr<(wabt::ExprType)9>::VarExpr(this_00,args,&local_48);
  *(VarExpr<(wabt::ExprType)9> **)this = this_00;
  return (__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)9>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)9>_>,_true,_true>
          )(__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)9>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)9>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}